

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBlock::FinalizeObject
          (LargeHeapBlock *this,Recycler *recycler,LargeObjectHeader *header)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  LargeObjectHeader **ppLVar4;
  undefined8 *puVar5;
  undefined8 *in_FS_OFFSET;
  LargeObjectHeader *header_local;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  ppLVar4 = HeaderList(this);
  if (ppLVar4[header->objectIndex] != header) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x74f,"(this->HeaderList()[header->objectIndex] == header)",
                       "this->HeaderList()[header->objectIndex] == header");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar3 = LargeObjectHeader::GetAttributes(header,this->heapInfo->recycler->Cookie);
  if ((bVar3 & 0x80) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x750,
                       "(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit)",
                       "header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  puVar5 = (undefined8 *)LargeObjectHeader::GetAddress(header);
  (**(code **)*puVar5)(puVar5,0);
  LargeObjectHeader::SetNext(header,this->heapInfo->recycler->Cookie,this->pendingDisposeObject);
  this->pendingDisposeObject = header;
  ppLVar4 = HeaderList(this);
  ppLVar4[header->objectIndex] = (LargeObjectHeader *)0x0;
  this->heapInfo->pendingDisposableObjectCount = this->heapInfo->pendingDisposableObjectCount + 1;
  return;
}

Assistant:

void
LargeHeapBlock::FinalizeObject(Recycler* recycler, LargeObjectHeader* header)
{
    // The header count can also be null if this object has already been finalized
    // but this method should never be called if the header list header is null
    Assert(this->HeaderList()[header->objectIndex] == header);
    Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit);

    // Call finalize to do clean up that needs to be done immediately
    // (e.g. Clear the ITrackable alias reference, so it can't be revived during
    // other finalizers or concurrent sweep)
    // Call it only if it hasn't already been finalized
    ((FinalizableObject *)header->GetAddress())->Finalize(false);
    header->SetNext(this->heapInfo->recycler->Cookie, this->pendingDisposeObject);
    this->pendingDisposeObject = header;

    // Null out the header in the header list- this means that this object has already
    // been finalized and is just pending dispose
    this->HeaderList()[header->objectIndex] = nullptr;

#ifdef RECYCLER_FINALIZE_CHECK
    this->heapInfo->pendingDisposableObjectCount++;
#endif
}